

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O0

void __thiscall
cppwinrt::writer_base<cppwinrt::writer>::writer_base(writer_base<cppwinrt::writer> *this)

{
  writer_base<cppwinrt::writer> *this_local;
  
  std::vector<char,_std::allocator<char>_>::vector(&this->m_second);
  std::vector<char,_std::allocator<char>_>::vector(&this->m_first);
  std::vector<char,_std::allocator<char>_>::reserve(&this->m_first,0x4000);
  return;
}

Assistant:

writer_base()
        {
            m_first.reserve(16 * 1024);
        }